

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiSmokeTests.cpp
# Opt level: O2

TestStatus *
vkt::api::anon_unknown_1::createSamplerTest(TestStatus *__return_storage_ptr__,Context *context)

{
  VkDevice device;
  DeviceInterface *vk;
  Move<vk::Handle<(vk::HandleType)20>_> tmpSampler;
  Move<vk::Handle<(vk::HandleType)20>_> tmp2Sampler;
  VkSamplerCreateInfo samplerInfo;
  RefBase<vk::Handle<(vk::HandleType)20>_> RStack_c8;
  RefBase<vk::Handle<(vk::HandleType)20>_> local_a8;
  undefined1 local_88 [32];
  undefined1 *local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  RefBase<vk::Handle<(vk::HandleType)20>_> local_38;
  
  device = Context::getDevice(context);
  vk = Context::getDeviceInterface(context);
  local_88._8_8_ = (void *)0x0;
  local_48._0_4_ = 0.0;
  local_48._4_4_ = 0.0;
  uStack_40._0_4_ = VK_BORDER_COLOR_FLOAT_TRANSPARENT_BLACK;
  uStack_40._4_4_ = 0;
  local_88._16_8_ = 0;
  local_88._24_4_ = VK_FILTER_NEAREST;
  local_88._28_4_ = VK_SAMPLER_MIPMAP_MODE_NEAREST;
  local_88._0_8_ = (pointer)0x1f;
  local_68 = &DAT_200000002;
  uStack_60._0_4_ = VK_SAMPLER_ADDRESS_MODE_CLAMP_TO_EDGE;
  uStack_60._4_4_ = 0.0;
  local_58._0_4_ = 0;
  local_58._4_4_ = 1.0;
  uStack_50._0_4_ = 0;
  uStack_50._4_4_ = VK_COMPARE_OP_ALWAYS;
  ::vk::createSampler((Move<vk::Handle<(vk::HandleType)20>_> *)&RStack_c8,vk,device,
                      (VkSamplerCreateInfo *)local_88,(VkAllocationCallbacks *)0x0);
  local_a8.m_data.deleter.m_device = (VkDevice)0x0;
  local_a8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  local_a8.m_data.object.m_internal = 0;
  local_a8.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)20>_>::operator=
            ((Move<vk::Handle<(vk::HandleType)20>_> *)&local_a8,
             (Move<vk::Handle<(vk::HandleType)20>_> *)&RStack_c8);
  local_38.m_data.deleter.m_device = local_a8.m_data.deleter.m_device;
  local_38.m_data.deleter.m_allocator = local_a8.m_data.deleter.m_allocator;
  local_38.m_data.object.m_internal = local_a8.m_data.object.m_internal;
  local_38.m_data.deleter.m_deviceIface = local_a8.m_data.deleter.m_deviceIface;
  local_a8.m_data.object.m_internal = 0;
  local_a8.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_a8.m_data.deleter.m_device = (VkDevice)0x0;
  local_a8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)20>_>::~RefBase(&local_38);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)20>_>::~RefBase(&local_a8);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)20>_>::~RefBase(&RStack_c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_88,"Creating sampler succeeded",(allocator<char> *)&RStack_c8);
  tcu::TestStatus::pass(__return_storage_ptr__,(string *)local_88);
  std::__cxx11::string::~string((string *)local_88);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus createSamplerTest (Context& context)
{
	const VkDevice			vkDevice	= context.getDevice();
	const DeviceInterface&	vk			= context.getDeviceInterface();

	{
		const struct VkSamplerCreateInfo		samplerInfo	=
		{
			VK_STRUCTURE_TYPE_SAMPLER_CREATE_INFO,		// sType
			DE_NULL,									// pNext
			0u,											// flags
			VK_FILTER_NEAREST,							// magFilter
			VK_FILTER_NEAREST,							// minFilter
			VK_SAMPLER_MIPMAP_MODE_NEAREST,				// mipmapMode
			VK_SAMPLER_ADDRESS_MODE_CLAMP_TO_EDGE,		// addressModeU
			VK_SAMPLER_ADDRESS_MODE_CLAMP_TO_EDGE,		// addressModeV
			VK_SAMPLER_ADDRESS_MODE_CLAMP_TO_EDGE,		// addressModeW
			0.0f,										// mipLodBias
			VK_FALSE,									// anisotropyEnable
			1.0f,										// maxAnisotropy
			DE_FALSE,									// compareEnable
			VK_COMPARE_OP_ALWAYS,						// compareOp
			0.0f,										// minLod
			0.0f,										// maxLod
			VK_BORDER_COLOR_FLOAT_TRANSPARENT_BLACK,	// borderColor
			VK_FALSE,									// unnormalizedCoords
		};

		Move<VkSampler>			tmpSampler	= createSampler(vk, vkDevice, &samplerInfo);
		Move<VkSampler>			tmp2Sampler;

		tmp2Sampler = tmpSampler;

		const Unique<VkSampler>	sampler		(tmp2Sampler);
	}

	return tcu::TestStatus::pass("Creating sampler succeeded");
}